

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QMap<QString,_QVariant>_>::moveAppend
          (QGenericArrayOps<QMap<QString,_QVariant>_> *this,QMap<QString,_QVariant> *b,
          QMap<QString,_QVariant> *e)

{
  QMap<QString,_QVariant> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QMap<QString,_QVariant> *in_RDI;
  QMap<QString,_QVariant> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QMap<QString,_QVariant>_>::begin
                        ((QArrayDataPointer<QMap<QString,_QVariant>_> *)0x14e9d7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QMap<QString,_QVariant>::QMap(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)((long)&((in_RDI[2].d.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                      super_QBasicAtomicInteger<int>._q_value + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }